

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

size_t phosg::skip_word(char *s,size_t offset)

{
  size_t sVar1;
  
  sVar1 = skip_non_whitespace(s,offset);
  sVar1 = skip_whitespace(s,sVar1);
  return sVar1;
}

Assistant:

size_t skip_word(const char* s, size_t offset) {
  return skip_whitespace(s, skip_non_whitespace(s, offset));
}